

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

LIBSSH2_CHANNEL *
channel_direct_streamlocal(LIBSSH2_SESSION *session,char *socket_path,char *shost,int sport)

{
  int iVar1;
  size_t sVar2;
  uchar *local_40;
  uchar *s;
  LIBSSH2_CHANNEL *channel;
  char *pcStack_28;
  int sport_local;
  char *shost_local;
  char *socket_path_local;
  LIBSSH2_SESSION *session_local;
  
  channel._4_4_ = sport;
  pcStack_28 = shost;
  shost_local = socket_path;
  socket_path_local = (char *)session;
  if (session->direct_state == libssh2_NB_state_idle) {
    sVar2 = strlen(socket_path);
    *(size_t *)(socket_path_local + 0x11b18) = sVar2;
    sVar2 = strlen(pcStack_28);
    *(size_t *)(socket_path_local + 0x11b20) = sVar2;
    *(long *)(socket_path_local + 0x11b28) =
         *(long *)(socket_path_local + 0x11b18) + *(long *)(socket_path_local + 0x11b20) + 0xc;
    local_40 = (uchar *)(**(code **)(socket_path_local + 8))
                                  (*(undefined8 *)(socket_path_local + 0x11b28),socket_path_local);
    *(uchar **)(socket_path_local + 0x11b10) = local_40;
    if (*(long *)(socket_path_local + 0x11b10) == 0) {
      _libssh2_error((LIBSSH2_SESSION *)socket_path_local,-6,
                     "Unable to allocate memory for direct-streamlocal connection");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    _libssh2_store_str(&local_40,shost_local,*(size_t *)(socket_path_local + 0x11b18));
    _libssh2_store_str(&local_40,pcStack_28,*(size_t *)(socket_path_local + 0x11b20));
    _libssh2_store_u32(&local_40,channel._4_4_);
  }
  s = (uchar *)_libssh2_channel_open
                         ((LIBSSH2_SESSION *)socket_path_local,"direct-streamlocal@openssh.com",0x1e
                          ,0x200000,0x8000,*(uchar **)(socket_path_local + 0x11b10),
                          *(size_t *)(socket_path_local + 0x11b28));
  if (((LIBSSH2_CHANNEL *)s == (LIBSSH2_CHANNEL *)0x0) &&
     (iVar1 = libssh2_session_last_errno((LIBSSH2_SESSION *)socket_path_local), iVar1 == -0x25)) {
    socket_path_local[0x11b0c] = '\x02';
    socket_path_local[0x11b0d] = '\0';
    socket_path_local[0x11b0e] = '\0';
    socket_path_local[0x11b0f] = '\0';
    return (LIBSSH2_CHANNEL *)0x0;
  }
  socket_path_local[0x11b0c] = '\0';
  socket_path_local[0x11b0d] = '\0';
  socket_path_local[0x11b0e] = '\0';
  socket_path_local[0x11b0f] = '\0';
  (**(code **)(socket_path_local + 0x18))
            (*(undefined8 *)(socket_path_local + 0x11b10),socket_path_local);
  socket_path_local[0x11b10] = '\0';
  socket_path_local[0x11b11] = '\0';
  socket_path_local[0x11b12] = '\0';
  socket_path_local[0x11b13] = '\0';
  socket_path_local[0x11b14] = '\0';
  socket_path_local[0x11b15] = '\0';
  socket_path_local[0x11b16] = '\0';
  socket_path_local[0x11b17] = '\0';
  return (LIBSSH2_CHANNEL *)s;
}

Assistant:

static LIBSSH2_CHANNEL *
channel_direct_streamlocal(LIBSSH2_SESSION * session, const char *socket_path,
                           const char *shost, int sport)
{
    LIBSSH2_CHANNEL *channel;
    unsigned char *s;

    if(session->direct_state == libssh2_NB_state_idle) {
        session->direct_host_len = strlen(socket_path);
        session->direct_shost_len = strlen(shost);
        session->direct_message_len =
            session->direct_host_len + session->direct_shost_len + 12;

        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Requesting direct-streamlocal session to %s",
                       socket_path));

        s = session->direct_message =
            LIBSSH2_ALLOC(session, session->direct_message_len);
        if(!session->direct_message) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                "Unable to allocate memory for direct-streamlocal connection");
            return NULL;
        }
        _libssh2_store_str(&s, socket_path, session->direct_host_len);
        _libssh2_store_str(&s, shost, session->direct_shost_len);
        _libssh2_store_u32(&s, sport);
    }

    channel =
        _libssh2_channel_open(session, "direct-streamlocal@openssh.com",
                              sizeof("direct-streamlocal@openssh.com") - 1,
                              LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                              LIBSSH2_CHANNEL_PACKET_DEFAULT,
                              session->direct_message,
                              session->direct_message_len);

    if(!channel &&
        libssh2_session_last_errno(session) == LIBSSH2_ERROR_EAGAIN) {
        /* The error code is still set to LIBSSH2_ERROR_EAGAIN, set our state
           to created to avoid re-creating the package on next invoke */
        session->direct_state = libssh2_NB_state_created;
        return NULL;
    }
    /* by default we set (keep?) idle state... */
    session->direct_state = libssh2_NB_state_idle;

    LIBSSH2_FREE(session, session->direct_message);
    session->direct_message = NULL;

    return channel;
}